

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.h
# Opt level: O1

u32 __thiscall HighsMatrixColoring::color(HighsMatrixColoring *this,double value)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  bool bVar3;
  const_iterator __pos;
  _Base_ptr p_Var4;
  double dVar5;
  double local_10;
  unsigned_long local_8;
  
  p_Var4 = (this->colorMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(this->colorMap)._M_t._M_impl.super__Rb_tree_header;
  __pos._M_node = &p_Var1->_M_header;
  if (p_Var4 != (_Base_ptr)0x0) {
    dVar5 = value - this->tolerance;
    do {
      bVar2 = dVar5 != *(double *)(p_Var4 + 1);
      bVar3 = *(double *)(p_Var4 + 1) <= dVar5;
      if (!bVar3 || !bVar2) {
        __pos._M_node = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[bVar3 && bVar2];
    } while (p_Var4 != (_Base_ptr)0x0);
  }
  if (((_Rb_tree_header *)__pos._M_node == p_Var1) ||
     (this->tolerance + value < *(double *)(__pos._M_node + 1))) {
    local_8 = (this->colorMap)._M_t._M_impl.super__Rb_tree_header._M_node_count + 1;
    local_10 = value;
    __pos._M_node =
         (_Base_ptr)
         std::
         _Rb_tree<double,std::pair<double_const,unsigned_int>,std::_Select1st<std::pair<double_const,unsigned_int>>,std::less<double>,std::allocator<std::pair<double_const,unsigned_int>>>
         ::_M_emplace_hint_unique<double&,unsigned_long>
                   ((_Rb_tree<double,std::pair<double_const,unsigned_int>,std::_Select1st<std::pair<double_const,unsigned_int>>,std::less<double>,std::allocator<std::pair<double_const,unsigned_int>>>
                     *)this,__pos,&local_10,&local_8);
  }
  return *(u32 *)&__pos._M_node[1]._M_parent;
}

Assistant:

u32 color(double value) {
    // iterator points to smallest element in map which fulfills key >= value -
    // tolerance
    auto it = colorMap.lower_bound(value - tolerance);
    // check if there is no such element, or if this element has a key value +
    // tolerance in which case we create a new color and store it with the key
    // value
    if (it == colorMap.end() || it->first > value + tolerance)
      it = colorMap.emplace_hint(it, value, colorMap.size() + 1);
    return it->second;
  }